

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O1

cmCommand * __thiscall cmLoadedCommand::Clone(cmLoadedCommand *this)

{
  cmCommand *pcVar1;
  long lVar2;
  cmLoadedCommandInfo *pcVar3;
  cmCommand *pcVar4;
  byte bVar5;
  
  bVar5 = 0;
  pcVar1 = (cmCommand *)operator_new(0xb0);
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar1->Helper).Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->Makefile = (cmMakefile *)0x0;
  pcVar1->Enabled = true;
  (pcVar1->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmLoadedCommand_00615fa8;
  pcVar1[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pcVar1[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1[1].super_cmObject._vptr_cmObject = (_func_int **)0x0;
  pcVar1[1].Makefile = (cmMakefile *)0x0;
  pcVar1[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&pcVar1[1].Enabled = 0;
  pcVar1[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar1[1].Error._M_string_length = 0;
  pcVar1[1].Error.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pcVar1[1].Error.field_2 + 8) = 0;
  pcVar1[2].super_cmObject._vptr_cmObject = (_func_int **)0x0;
  pcVar1[2].Makefile = (cmMakefile *)0x0;
  pcVar1[1].Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&cmStaticCAPI;
  pcVar3 = &this->info;
  pcVar4 = pcVar1 + 1;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pcVar4->super_cmObject)._vptr_cmObject = (_func_int **)pcVar3->reserved1;
    pcVar3 = (cmLoadedCommandInfo *)((long)pcVar3 + (ulong)bVar5 * -0x10 + 8);
    pcVar4 = (cmCommand *)((long)pcVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pcVar1;
}

Assistant:

virtual cmCommand* Clone()
    {
      cmLoadedCommand *newC = new cmLoadedCommand;
      // we must copy when we clone
      memcpy(&newC->info,&this->info,sizeof(info));
      return newC;
    }